

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O0

void __thiscall
TEST_WiningStateTest_DoubleReady_TestShell::~TEST_WiningStateTest_DoubleReady_TestShell
          (TEST_WiningStateTest_DoubleReady_TestShell *this)

{
  TEST_WiningStateTest_DoubleReady_TestShell *mem;
  TEST_WiningStateTest_DoubleReady_TestShell *this_local;
  
  mem = this;
  ~TEST_WiningStateTest_DoubleReady_TestShell(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(WiningStateTest, DoubleReady)
{
	addNoWiningHand();

	h.doubleReady();
	winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::DoubleReady));
	CHECK_EQUAL(2, r.doubling_factor);
}